

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,Uint32 utf32Char)

{
  undefined8 in_RDI;
  uint __c;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *unaff_retaddr;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffe0;
  
  __c = (uint)((ulong)in_RDI >> 0x20);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(unaff_retaddr);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(in_stack_ffffffffffffffe0,__c);
  return;
}

Assistant:

String::String(Uint32 utf32Char)
{
    m_string += utf32Char;
}